

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O0

UnitsMap * __thiscall
libcellml::Analyser::AnalyserImpl::multiplyDivideUnitsMaps
          (UnitsMap *__return_storage_ptr__,AnalyserImpl *this,UnitsMap *firstUnitsMap,
          UnitsMap *secondUnitsMap,bool multiply)

{
  double dVar1;
  bool bVar2;
  pointer ppVar3;
  double local_a8;
  double local_80;
  _Self local_78 [3];
  _Self local_60;
  iterator it;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *units;
  const_iterator __end1;
  const_iterator __begin1;
  UnitsMap *__range1;
  double sign;
  bool multiply_local;
  UnitsMap *secondUnitsMap_local;
  UnitsMap *firstUnitsMap_local;
  AnalyserImpl *this_local;
  UnitsMap *res;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::map(__return_storage_ptr__,firstUnitsMap);
  local_a8 = 1.0;
  if (!multiply) {
    local_a8 = -1.0;
  }
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
           ::begin(secondUnitsMap);
  units = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
           *)std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
             ::end(secondUnitsMap);
  while (bVar2 = std::operator!=(&__end1,(_Self *)&units), bVar2) {
    it._M_node = (_Base_ptr)
                 std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                 ::operator*(&__end1);
    local_60._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
         ::find(__return_storage_ptr__,(key_type *)it._M_node);
    local_78[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
         ::end(__return_storage_ptr__);
    bVar2 = std::operator==(&local_60,local_78);
    if (bVar2) {
      local_80 = local_a8 * *(double *)(it._M_node + 1);
      std::
      map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>
      ::emplace<std::__cxx11::string_const&,double>
                ((map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>
                  *)__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)it._M_node,
                 &local_80);
    }
    else {
      dVar1 = *(double *)(it._M_node + 1);
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
               ::operator->(&local_60);
      ppVar3->second = local_a8 * dVar1 + ppVar3->second;
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
               ::operator->(&local_60);
      bVar2 = areNearlyEqual(ppVar3->second,0.0);
      if (bVar2) {
        std::
        map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>
        ::erase_abi_cxx11_((map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>
                            *)__return_storage_ptr__,(iterator)local_60._M_node);
      }
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

UnitsMap Analyser::AnalyserImpl::multiplyDivideUnitsMaps(const UnitsMap &firstUnitsMap,
                                                         const UnitsMap &secondUnitsMap,
                                                         bool multiply)
{
    // Multiply/divide the given units maps together, following a multiplication
    // (multiply = true) or a division (multiply = false).

    auto res = firstUnitsMap;
    auto sign = multiply ? 1.0 : -1.0;

    for (const auto &units : secondUnitsMap) {
        auto it = res.find(units.first);

        if (it == res.end()) {
            res.emplace(units.first, sign * units.second);
        } else {
            it->second += sign * units.second;

            if (areNearlyEqual(it->second, 0.0)) {
                // The units has now an exponent value of zero, so no need to
                // track it anymore.

                res.erase(it);
            }
        }
    }

    return res;
}